

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::IncrementVarUsage(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *this,int v)

{
  bool bVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined4 in_ESI;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  int in_stack_00000014;
  Error *in_stack_00000018;
  CStringRef in_stack_00000020;
  ConInfo *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  piVar2 = VarUsageRef((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  *piVar2 = *piVar2 + 1;
  GetInitExpression(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  bVar1 = IsUnused(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    GetInitExpression(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    bVar1 = IsBridgingToBeConsidered(in_RDI,in_stack_ffffffffffffffc8);
    if (!bVar1) {
      uVar3 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,
                 "An expression\'s redefinition\ncould be lost. Please contact\nAMPL customer support."
                );
      Error::Error(in_stack_00000018,in_stack_00000020,in_stack_00000014);
      __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void IncrementVarUsage(int v) {
		++VarUsageRef(v);
    // If unused, no reformulation tried,
    // currently no repetition of reformulation cycle.
    MP_ASSERT_ALWAYS(!IsUnused(GetInitExpression(v))
        || IsBridgingToBeConsidered(GetInitExpression(v)),
                     "An expression's redefinition\n"
                     "could be lost. Please contact\n"
                     "AMPL customer support.");
	}